

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

int INT_EVunfreeze_stone(CManager_conflict cm,EVstone stone_id)

{
  int iVar1;
  stone_type p_Var2;
  CMTaskHandle __ptr;
  
  p_Var2 = stone_struct(cm->evp,stone_id);
  if (p_Var2 == (stone_type)0x0) {
    iVar1 = -1;
  }
  else {
    p_Var2->is_frozen = 0;
    __ptr = INT_CMadd_delayed_task(cm,0,0,deferred_process_actions,(void *)0x0);
    free(__ptr);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

extern int
INT_EVunfreeze_stone(CManager cm, EVstone stone_id)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    CMTaskHandle handle;
    stone = stone_struct(evp, stone_id);
    if (!stone) return -1;

    stone->is_frozen = 0;
    /* ensure that we run the process_actions loop soon so the stone's
       pending events (or pending output) won't be ignored */
    handle = INT_CMadd_delayed_task(cm, 0, 0, deferred_process_actions, NULL);
    free(handle); /* we don't need this */
    return 1;	
}